

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a1.cpp
# Opt level: O0

void __thiscall RasterizerA1::_renderImpl<CompositorScalar,true>(RasterizerA1 *this,uint32_t argb32)

{
  int iVar1;
  int iVar2;
  Cell *pCVar3;
  uint32_t bPix;
  uint32_t uVar4;
  intptr_t iVar5;
  long lVar6;
  uint32_t *puVar7;
  int local_cc;
  int cover;
  size_t x0;
  Cell *cell;
  uint32_t *dstPix;
  int y;
  CompositorScalar compositor;
  intptr_t stride;
  uint8_t *dstLine;
  int h;
  int w;
  uint32_t argb32_local;
  RasterizerA1 *this_local;
  uint32_t mask;
  ulong local_50;
  uint32_t local_34;
  
  iVar1 = (this->super_CellRasterizer).super_Rasterizer._width;
  iVar2 = (this->super_CellRasterizer).super_Rasterizer._height;
  stride = (intptr_t)Image::data<unsigned_char>((this->super_CellRasterizer).super_Rasterizer._dst);
  iVar5 = Image::stride((this->super_CellRasterizer).super_Rasterizer._dst);
  bPix = PixelUtils::premultiply(argb32);
  for (dstPix._0_4_ = 0; (int)dstPix < iVar2; dstPix._0_4_ = (int)dstPix + 1) {
    pCVar3 = this->_cells;
    lVar6 = (long)(int)dstPix * this->_cellStride;
    local_cc = 0;
    for (local_50 = 0; local_50 < (ulong)(long)iVar1; local_50 = local_50 + 1) {
      local_cc = pCVar3[lVar6 + local_50].cover + local_cc;
      local_34 = local_cc - (pCVar3[lVar6 + local_50].area >> 9);
      if ((int)local_34 < 0) {
        local_34 = -local_34;
      }
      if (0xff < (int)local_34) {
        local_34 = 0xff;
      }
      Cell::reset(pCVar3 + lVar6 + local_50);
      if (local_34 == 0xff) {
        *(uint32_t *)(stride + local_50 * 4) = bPix;
      }
      else {
        puVar7 = (uint32_t *)(stride + local_50 * 4);
        uVar4 = PixelUtils::src(*puVar7,bPix,local_34);
        *puVar7 = uVar4;
      }
    }
    stride = iVar5 + stride;
  }
  return;
}

Assistant:

inline void RasterizerA1::_renderImpl(uint32_t argb32) noexcept {
  int w = _width;
  int h = _height;

  uint8_t* dstLine = _dst->data();
  intptr_t stride = _dst->stride();

  Compositor compositor(argb32);
  for (int y = 0; y < h; y++, dstLine += stride) {
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);
    Cell* cell = &_cells[y * _cellStride];

    size_t x0 = 0;
    int cover = 0;
    compositor.template vmask<NonZero>(dstPix, x0, w, cell, cover);
  }
}